

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O2

void __thiscall
RenX_ChatLogPlugin::RenX_OnTeamChat
          (RenX_ChatLogPlugin *this,Server *server,PlayerInfo *player,string_view message)

{
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"TEAM",&local_51);
  WriteToLog(this,server,player,message,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void RenX_ChatLogPlugin::RenX_OnTeamChat(RenX::Server& server, const RenX::PlayerInfo& player, std::string_view  message)
{
	WriteToLog(server, player, message, "TEAM");
}